

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

void altersingle(nn_quant *nnq,int alpha,int i,int al,int b,int g,int r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = nnq->network[i][0];
  iVar3 = nnq->network[i][1];
  iVar4 = (iVar1 - al) * alpha;
  iVar2 = iVar4 + 0x3ff;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  iVar5 = (iVar3 - b) * alpha;
  iVar4 = iVar5 + 0x3ff;
  if (-1 < iVar5) {
    iVar4 = iVar5;
  }
  nnq->network[i][0] = iVar1 - (iVar2 >> 10);
  nnq->network[i][1] = iVar3 - (iVar4 >> 10);
  iVar1 = nnq->network[i][2];
  iVar2 = (iVar1 - g) * alpha;
  iVar3 = iVar2 + 0x3ff;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  nnq->network[i][2] = iVar1 - (iVar3 >> 10);
  iVar1 = nnq->network[i][3];
  iVar2 = (iVar1 - r) * alpha;
  iVar3 = iVar2 + 0x3ff;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  nnq->network[i][3] = iVar1 - (iVar3 >> 10);
  return;
}

Assistant:

void altersingle(nnq, alpha,i,al,b,g,r)
nn_quant *nnq;
register int alpha,i,al,b,g,r;
{
	register int *n;

	n = nnq->network[i];	/* alter hit neuron */
	*n -= (alpha*(*n - al)) / initalpha;
	n++;
	*n -= (alpha*(*n - b)) / initalpha;
	n++;
	*n -= (alpha*(*n - g)) / initalpha;
	n++;
	*n -= (alpha*(*n - r)) / initalpha;
}